

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_long,double>
          (Thread *this,BinopFunc<unsigned_long,_double> *f)

{
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  double dVar1;
  Simd<double,_(unsigned_char)__x02_> SVar2;
  byte local_49;
  unsigned_long uStack_48;
  u8 i;
  SR result;
  Simd<double,_(unsigned_char)__x02_> lhs;
  Simd<double,_(unsigned_char)__x02_> rhs;
  BinopFunc<unsigned_long,_double> *f_local;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  SVar2 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  result.v[1] = (unsigned_long)SVar2.v[0];
  lhs.v[0] = SVar2.v[1];
  for (local_49 = 0; local_49 < 2; local_49 = local_49 + 1) {
    dVar1 = (double)(*f)((double)result.v[(ulong)local_49 + 1],lhs.v[(ulong)local_49 + 1]);
    lhs.v[(ulong)local_49 - 3] = dVar1;
  }
  value.v[1] = result.v[0];
  value.v[0] = uStack_48;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}